

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O3

void __thiscall clunk::Node::GenerateMoves<true,true>(Node *this,int depth)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = DAT_001688f4;
  if (_piece != '\0') {
    __assert_fail("!_piece[0].type",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8aa,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (DAT_00168814 != '\f') {
    __assert_fail("_piece[WhiteKingOffset].type == (White|King)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8ab,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (DAT_00168816 != '\r') {
    __assert_fail("_piece[BlackKingOffset].type == (Black|King)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8ac,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (*_KING != '\f') {
    __assert_fail("_KING[White]->type == (White|King)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8ad,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (*PTR_DAT_0015c338 != '\r') {
    __assert_fail("_KING[Black]->type == (Black|King)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8ae,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if ((_KING[1] & 0x88) != 0) {
    __assert_fail("IS_SQUARE(_KING[White]->sqr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8af,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if ((undefined *)(&_board)[(byte)_KING[1]] != _KING) {
    __assert_fail("_board[_KING[White]->sqr] == _KING[White]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8b1,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if ((undefined *)(&_board)[(byte)PTR_DAT_0015c338[1]] != PTR_DAT_0015c338) {
    __assert_fail("_board[_KING[Black]->sqr] == _KING[Black]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8b2,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (0xd < _pcount) {
    __assert_fail("(_pcount[White] >= 0) & (_pcount[White] <= 13)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8b3,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (0xd < DAT_001688e4) {
    __assert_fail("(_pcount[Black] >= 0) & (_pcount[Black] <= 13)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8b4,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (_pcount != DAT_00168900 + DAT_001688f8 + DAT_00168908) {
    __assert_fail("_pcount[White] == (_pcount[White|Bishop] + _pcount[White|Rook] + _pcount[White|Queen])"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8b6,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (DAT_001688e4 != DAT_00168904 + DAT_001688fc + DAT_0016890c) {
    __assert_fail("_pcount[Black] == (_pcount[Black|Bishop] + _pcount[Black|Rook] + _pcount[Black|Queen])"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8b8,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (8 < DAT_001688e8) {
    __assert_fail("(_pcount[White|Pawn] >= 0) & (_pcount[White|Pawn] <= 8)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8b9,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  uVar5 = (ulong)DAT_001688ec;
  if (8 < uVar5) {
    __assert_fail("(_pcount[Black|Pawn] >= 0) & (_pcount[Black|Pawn] <= 8)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8ba,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (10 < DAT_001688f0) {
    __assert_fail("(_pcount[White|Knight] >= 0) & (_pcount[White|Knight] <= 10)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8bb,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (10 < DAT_001688f4) {
    __assert_fail("(_pcount[Black|Knight] >= 0) & (_pcount[Black|Knight] <= 10)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8bc,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (10 < DAT_001688f8) {
    __assert_fail("(_pcount[White|Bishop] >= 0) & (_pcount[White|Bishop] <= 10)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8bd,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (10 < DAT_001688fc) {
    __assert_fail("(_pcount[Black|Bishop] >= 0) & (_pcount[Black|Bishop] <= 10)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8be,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (10 < DAT_00168900) {
    __assert_fail("(_pcount[White|Rook] >= 0) & (_pcount[White|Rook] <= 10)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8bf,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (10 < DAT_00168904) {
    __assert_fail("(_pcount[Black|Rook] >= 0) & (_pcount[Black|Rook] <= 10)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8c0,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (9 < DAT_00168908) {
    __assert_fail("(_pcount[White|Queen] >= 0) & (_pcount[White|Queen] <= 9)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8c1,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (9 < DAT_0016890c) {
    __assert_fail("(_pcount[Black|Queen] >= 0) & (_pcount[Black|Queen] <= 9)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8c2,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  this->moveIndex = 0;
  this->moveCount = 0;
  uVar2 = this->checks;
  if (0xffff < uVar2) {
    __assert_fail("!(checks & ~0xFFFF)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8c6,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (uVar2 < 0x100) {
    if (uVar2 == 0) {
      if (uVar5 != 0) {
        do {
          uVar5 = uVar5 - 1;
          GetPawnMoves<true,true>(this,(uint)(byte)(&DAT_00168829)[uVar5 * 2],depth);
          uVar4 = DAT_001688f4;
        } while ((int)uVar5 != 0);
      }
      if (uVar4 != 0) {
        uVar5 = (ulong)uVar4;
        do {
          if ((int)uVar5 < 1) {
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x8dc,
                          "void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                         );
          }
          lVar1 = uVar5 * 2;
          uVar5 = uVar5 - 1;
          GetKnightMoves<true>(this,true,(uint)(byte)(&DAT_0016884b)[lVar1],depth);
        } while ((int)uVar5 != 0);
      }
      uVar5 = (ulong)DAT_001688fc;
      if (uVar5 != 0) {
        do {
          if ((int)uVar5 < 1) {
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x8e2,
                          "void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                         );
          }
          lVar1 = uVar5 * 2;
          uVar5 = uVar5 - 1;
          GetSliderCaptures(this,true,BishopMove,
                            *(uint64_t *)(_atk + (ulong)(byte)(&DAT_00168873)[lVar1] * 8 + 0x40),
                            (uint)(byte)(&DAT_00168873)[lVar1]);
        } while ((int)uVar5 != 0);
      }
      uVar5 = (ulong)DAT_00168904;
      if (uVar5 != 0) {
        do {
          if ((int)uVar5 < 1) {
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x8ed,
                          "void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                         );
          }
          lVar1 = uVar5 * 2;
          uVar5 = uVar5 - 1;
          GetSliderCaptures(this,true,RookMove,
                            *(uint64_t *)(_atk + (ulong)(byte)(&DAT_0016889b)[lVar1] * 8 + 0x40),
                            (uint)(byte)(&DAT_0016889b)[lVar1]);
        } while ((int)uVar5 != 0);
      }
      uVar5 = (ulong)DAT_0016890c;
      if (uVar5 != 0) {
        do {
          if ((int)uVar5 < 1) {
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x8f8,
                          "void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                         );
          }
          lVar1 = uVar5 * 2;
          uVar5 = uVar5 - 1;
          GetSliderCaptures(this,true,QueenMove,
                            *(uint64_t *)(_atk + (ulong)(byte)(&DAT_001688c3)[lVar1] * 8 + 0x40),
                            (uint)(byte)(&DAT_001688c3)[lVar1]);
        } while ((int)uVar5 != 0);
      }
      if ((depth == 0) && (DAT_001688e4 != 0)) {
        GetSliderChecks<true>(this);
      }
      GetKingMoves<true,true>(this,depth);
      iVar3 = DuplicateMoveCount(this);
      if (iVar3 != 0) {
        __assert_fail("!DuplicateMoveCount()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x907,
                      "void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]");
      }
    }
    else {
      GetCheckEvasions<true>(this);
      iVar3 = DuplicateMoveCount(this);
      if (iVar3 != 0) {
        __assert_fail("!DuplicateMoveCount()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x8d0,
                      "void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]");
      }
    }
  }
  else {
    if ((char)uVar2 == '\0') {
      __assert_fail("checks & 0xFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x8c8,
                    "void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]");
    }
    GetKingEscapes<true>(this);
    iVar3 = DuplicateMoveCount(this);
    if (iVar3 != 0) {
      __assert_fail("!DuplicateMoveCount()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x8ca,
                    "void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]");
    }
  }
  return;
}

Assistant:

void GenerateMoves(const int depth) {
    assert(!_piece[0].type);
    assert(_piece[WhiteKingOffset].type == (White|King));
    assert(_piece[BlackKingOffset].type == (Black|King));
    assert(_KING[White]->type == (White|King));
    assert(_KING[Black]->type == (Black|King));
    assert(IS_SQUARE(_KING[White]->sqr));
    assert(IS_SQUARE(_KING[White]->sqr));
    assert(_board[_KING[White]->sqr] == _KING[White]);
    assert(_board[_KING[Black]->sqr] == _KING[Black]);
    assert((_pcount[White] >= 0) & (_pcount[White] <= 13));
    assert((_pcount[Black] >= 0) & (_pcount[Black] <= 13));
    assert(_pcount[White] == (_pcount[White|Bishop] + _pcount[White|Rook] +
                              _pcount[White|Queen]));
    assert(_pcount[Black] == (_pcount[Black|Bishop] + _pcount[Black|Rook] +
                              _pcount[Black|Queen]));
    assert((_pcount[White|Pawn] >= 0) & (_pcount[White|Pawn] <= 8));
    assert((_pcount[Black|Pawn] >= 0) & (_pcount[Black|Pawn] <= 8));
    assert((_pcount[White|Knight] >= 0) & (_pcount[White|Knight] <= 10));
    assert((_pcount[Black|Knight] >= 0) & (_pcount[Black|Knight] <= 10));
    assert((_pcount[White|Bishop] >= 0) & (_pcount[White|Bishop] <= 10));
    assert((_pcount[Black|Bishop] >= 0) & (_pcount[Black|Bishop] <= 10));
    assert((_pcount[White|Rook] >= 0) & (_pcount[White|Rook] <= 10));
    assert((_pcount[Black|Rook] >= 0) & (_pcount[Black|Rook] <= 10));
    assert((_pcount[White|Queen] >= 0) & (_pcount[White|Queen] <= 9));
    assert((_pcount[Black|Queen] >= 0) & (_pcount[Black|Queen] <= 9));

    moveCount = moveIndex = 0;

    assert(!(checks & ~0xFFFF));
    if (checks & 0xFF00) { // double check
      assert(checks & 0xFF);
      GetKingEscapes<color>();
      assert(!DuplicateMoveCount());
      return;
    }

    if (checks & 0xFF) { // single check
      GetCheckEvasions<color>();
      assert(!DuplicateMoveCount());
      return;
    }

    int from;
    for (int i = _pcount[color|Pawn]; i--; ) {
      assert(i >= 0);
      from = _piece[(color ? BlackPawnOffset : PawnOffset) + i].sqr;
      GetPawnMoves<color, qsearch>(from, depth);
    }

    for (int i = _pcount[color|Knight]; i--; ) {
      assert(i >= 0);
      from = _piece[(color ? BlackKnightOffset : KnightOffset) + i].sqr;
      GetKnightMoves<qsearch>(color, from, depth);
    }

    for (int i = _pcount[color|Bishop]; i--; ) {
      assert(i >= 0);
      from = _piece[(color ? BlackBishopOffset : BishopOffset) + i].sqr;
      if (qsearch) {
        GetSliderCaptures(color, BishopMove, _atk[from + 8], from);
      }
      else {
        GetSliderMoves(color, BishopMove, _bishopRook[from], from);
      }
    }

    for (int i = _pcount[color|Rook]; i--; ) {
      assert(i >= 0);
      from = _piece[(color ? BlackRookOffset : RookOffset) + i].sqr;
      if (qsearch) {
        GetSliderCaptures(color, RookMove, _atk[from + 8], from);
      }
      else {
        GetSliderMoves(color, RookMove, _bishopRook[from + 8], from);
      }
    }

    for (int i = _pcount[color|Queen]; i--; ) {
      assert(i >= 0);
      from = _piece[(color ? BlackQueenOffset : QueenOffset) + i].sqr;
      if (qsearch) {
        GetSliderCaptures(color, QueenMove, _atk[from + 8], from);
      }
      else {
        GetSliderMoves(color, QueenMove, _queenKing[from], from);
      }
    }

    if (qsearch && _pcount[color] && !depth) {
      GetSliderChecks<color>();
    }

    GetKingMoves<color, qsearch>(depth);
    assert(!DuplicateMoveCount());
  }